

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

uint32_t __thiscall
toml::detail::syntax::non_ascii_key_char::read_utf8(non_ascii_key_char *this,location *loc)

{
  element_type *peVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  
  bVar2 = location::current(loc);
  location::advance(loc,1);
  uVar5 = (uint)bVar2;
  uVar6 = (uint)bVar2;
  if ((char)bVar2 < '\0') {
    if ((bVar2 & 0xe0) == 0xc0) {
      bVar2 = location::current(loc);
      location::advance(loc,1);
      uVar6 = (uVar6 & 0x1f) << 6;
      uVar5 = 0xffffffff;
      if (0x7f < uVar6) {
        uVar5 = bVar2 & 0x3f | uVar6;
      }
    }
    else if ((bVar2 & 0xf0) == 0xe0) {
      bVar2 = location::current(loc);
      location::advance(loc,1);
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (loc->location_ <
          (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start)) {
        bVar3 = location::current(loc);
        location::advance(loc,1);
        uVar6 = (uint)(bVar2 & 0x3f) << 6 | (uVar6 & 0xf) << 0xc;
        uVar5 = 0xffffffff;
        if (0x7ff < uVar6) {
          uVar5 = bVar3 & 0x3f | uVar6;
        }
      }
      else {
        uVar5 = 0xffffffff;
      }
    }
    else {
      uVar5 = 0xffffffff;
      if ((bVar2 & 0xf8) == 0xf0) {
        bVar2 = location::current(loc);
        location::advance(loc,1);
        peVar1 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (loc->location_ <
            (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start)) {
          bVar3 = location::current(loc);
          location::advance(loc,1);
          peVar1 = (loc->source_).
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if (loc->location_ <
              (ulong)((long)(peVar1->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(peVar1->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start)) {
            bVar4 = location::current(loc);
            location::advance(loc,1);
            uVar6 = (uint)(bVar2 & 0x3f) << 0xc | (uVar6 & 7) << 0x12;
            if (0xffff < uVar6) {
              uVar5 = (uint)(bVar4 & 0x3f) | (uint)(bVar3 & 0x3f) << 6 | uVar6;
            }
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

TOML11_INLINE std::uint32_t non_ascii_key_char::read_utf8(location& loc) const
{
    // U+0000   ... U+0079  ; 0xxx_xxxx
    // U+0080   ... U+07FF  ; 110y_yyyx 10xx_xxxx;
    // U+0800   ... U+FFFF  ; 1110_yyyy 10yx_xxxx 10xx_xxxx
    // U+010000 ... U+10FFFF; 1111_0yyy 10yy_xxxx 10xx_xxxx 10xx_xxxx

    const unsigned char b1 = loc.current(); loc.advance(1);
    if(b1 < 0x80)
    {
        return static_cast<std::uint32_t>(b1);
    }
    else if((b1 >> 5) == 6) // 0b110 == 6
    {
        const auto b2 = loc.current(); loc.advance(1);

        const std::uint32_t c1 = b1 & ((1 << 5) - 1);
        const std::uint32_t c2 = b2 & ((1 << 6) - 1);
        const std::uint32_t codep = (c1 << 6) + c2;

        if(codep < 0x80)
        {
            return 0xFFFFFFFF;
        }
        return codep;
    }
    else if((b1 >> 4) == 14) // 0b1110 == 14
    {
        const auto b2 = loc.current(); loc.advance(1); if(loc.eof()) {return 0xFFFFFFFF;}
        const auto b3 = loc.current(); loc.advance(1);

        const std::uint32_t c1 = b1 & ((1 << 4) - 1);
        const std::uint32_t c2 = b2 & ((1 << 6) - 1);
        const std::uint32_t c3 = b3 & ((1 << 6) - 1);

        const std::uint32_t codep = (c1 << 12) + (c2 << 6) + c3;
        if(codep < 0x800)
        {
            return 0xFFFFFFFF;
        }
        return codep;
    }
    else if((b1 >> 3) == 30) // 0b11110 == 30
    {
        const auto b2 = loc.current(); loc.advance(1); if(loc.eof()) {return 0xFFFFFFFF;}
        const auto b3 = loc.current(); loc.advance(1); if(loc.eof()) {return 0xFFFFFFFF;}
        const auto b4 = loc.current(); loc.advance(1);

        const std::uint32_t c1 = b1 & ((1 << 3) - 1);
        const std::uint32_t c2 = b2 & ((1 << 6) - 1);
        const std::uint32_t c3 = b3 & ((1 << 6) - 1);
        const std::uint32_t c4 = b4 & ((1 << 6) - 1);
        const std::uint32_t codep = (c1 << 18) + (c2 << 12) + (c3 << 6) + c4;

        if(codep < 0x10000)
        {
            return 0xFFFFFFFF;
        }
        return codep;
    }
    else // not a Unicode codepoint in UTF-8
    {
        return 0xFFFFFFFF;
    }
}